

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

lua_Unsigned luaH_getn(Table *t)

{
  Value *pVVar1;
  long lVar2;
  lua_Unsigned lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  lua_Unsigned key;
  
  uVar5 = t->asize;
  uVar6 = (ulong)uVar5;
  if (uVar6 != 0) {
    pVVar1 = t->array;
    uVar7 = *(uint *)pVVar1 + (uint)(*(uint *)pVVar1 == 0);
    uVar8 = (ulong)uVar7;
    if ((*(byte *)((long)pVVar1 + (ulong)(uVar7 - 1) + 4) & 0xf) == 0) {
      uVar5 = 0;
      do {
        if ((uVar8 < 2) || (3 < uVar5)) {
          uVar6 = uVar8;
          uVar8 = 0;
          goto LAB_00119916;
        }
        uVar5 = uVar5 + 1;
        lVar2 = uVar8 + 2;
        uVar8 = uVar8 - 1;
      } while ((*(byte *)((long)pVVar1 + lVar2) & 0xf) == 0);
      uVar8 = (ulong)(uVar7 - uVar5);
LAB_001198a8:
      *(uint *)pVVar1 = (uint)uVar8;
      return uVar8;
    }
    for (uVar7 = 0; (uVar8 < uVar6 && (uVar7 < 4)); uVar7 = uVar7 + 1) {
      if ((*(byte *)((long)pVVar1 + uVar8 + 4) & 0xf) == 0) goto LAB_001198a8;
      uVar8 = uVar8 + 1;
    }
    if ((*(byte *)((long)pVVar1 + (ulong)(uVar5 - 1) + 4) & 0xf) == 0) {
LAB_00119916:
      uVar5 = binsearch(t,(uint)uVar8,(uint)uVar6);
      *(uint *)pVVar1 = uVar5;
      return (ulong)uVar5;
    }
    *(uint *)pVVar1 = uVar5;
  }
  if (((t->flags & 0x40) == 0) && (iVar4 = hashkeyisempty(t,(ulong)(uVar5 + 1)), iVar4 == 0)) {
    uVar6 = (ulong)(uVar5 + (uVar5 == 0));
    do {
      lVar3 = uVar6;
      if (uVar6 >> 0x3e != 0) {
        key = 0x7fffffffffffffff;
        iVar4 = hashkeyisempty(t,0x7fffffffffffffff);
        if (iVar4 == 0) {
          return 0x7fffffffffffffff;
        }
        break;
      }
      key = uVar6 * 2;
      iVar4 = hashkeyisempty(t,key);
      uVar6 = key;
    } while (iVar4 == 0);
    while (uVar6 = lVar3, 1 < key - uVar6) {
      uVar8 = uVar6 + key >> 1;
      iVar4 = hashkeyisempty(t,uVar8);
      lVar3 = uVar8;
      if (iVar4 != 0) {
        lVar3 = uVar6;
        key = uVar8;
      }
    }
  }
  return uVar6;
}

Assistant:

lua_Unsigned luaH_getn (Table *t) {
  unsigned asize = t->asize;
  if (asize > 0) {  /* is there an array part? */
    const unsigned maxvicinity = 4;
    unsigned limit = *lenhint(t);  /* start with the hint */
    if (limit == 0)
      limit = 1;  /* make limit a valid index in the array */
    if (arraykeyisempty(t, limit)) {  /* t[limit] empty? */
      /* there must be a border before 'limit' */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit > 1; i++) {
        limit--;
        if (!arraykeyisempty(t, limit))
          return newhint(t, limit);  /* 'limit' is a border */
      }
      /* t[limit] still empty; search for a border in [0, limit) */
      return newhint(t, binsearch(t, 0, limit));
    }
    else {  /* 'limit' is present in table; look for a border after it */
      unsigned i;
      /* look for a border in the vicinity of the hint */
      for (i = 0; i < maxvicinity && limit < asize; i++) {
        limit++;
        if (arraykeyisempty(t, limit))
          return newhint(t, limit - 1);  /* 'limit - 1' is a border */
      }
      if (arraykeyisempty(t, asize)) {  /* last element empty? */
        /* t[limit] not empty; search for a border in [limit, asize) */
        return newhint(t, binsearch(t, limit, asize));
      }
    }
    /* last element non empty; set a hint to speed up finding that again */
    /* (keys in the hash part cannot be hints) */
    *lenhint(t) = asize;
  }
  /* no array part or t[asize] is not empty; check the hash part */
  lua_assert(asize == 0 || !arraykeyisempty(t, asize));
  if (isdummy(t) || hashkeyisempty(t, asize + 1))
    return asize;  /* 'asize + 1' is empty */
  else  /* 'asize + 1' is also non empty */
    return hash_search(t, asize);
}